

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

void __thiscall dxil_spv::Converter::Impl::mark_used_values(Impl *this,Instruction *instruction)

{
  bool bVar1;
  ValueKind VVar2;
  uint uVar3;
  PHINode *pPVar4;
  ReturnInst *this_00;
  Value *pVVar5;
  BranchInst *this_01;
  SwitchInst *this_02;
  SwitchInst *this_03;
  uint uVar6;
  PHINode *this_04;
  ReturnInst *this_05;
  BranchInst *this_06;
  
  if (instruction == (Instruction *)0x0) {
    this_04 = (PHINode *)0x0;
  }
  else {
    pPVar4 = (PHINode *)LLVMBC::Internal::resolve_proxy(&instruction->super_Value);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)pPVar4);
    this_04 = (PHINode *)0x0;
    if (VVar2 == PHI) {
      this_04 = pPVar4;
    }
  }
  if (this_04 == (PHINode *)0x0) {
    if (instruction == (Instruction *)0x0) {
      this_05 = (ReturnInst *)0x0;
    }
    else {
      this_00 = (ReturnInst *)LLVMBC::Internal::resolve_proxy(&instruction->super_Value);
      VVar2 = LLVMBC::Value::get_value_kind((Value *)this_00);
      this_05 = (ReturnInst *)0x0;
      if (VVar2 == Return) {
        this_05 = this_00;
      }
    }
    if (this_05 == (ReturnInst *)0x0) {
      if (instruction == (Instruction *)0x0) {
        this_06 = (BranchInst *)0x0;
      }
      else {
        this_01 = (BranchInst *)LLVMBC::Internal::resolve_proxy(&instruction->super_Value);
        VVar2 = LLVMBC::Value::get_value_kind((Value *)this_01);
        this_06 = (BranchInst *)0x0;
        if (VVar2 == Branch) {
          this_06 = this_01;
        }
      }
      if (this_06 == (BranchInst *)0x0) {
        if (instruction == (Instruction *)0x0) {
          this_03 = (SwitchInst *)0x0;
        }
        else {
          this_02 = (SwitchInst *)LLVMBC::Internal::resolve_proxy(&instruction->super_Value);
          VVar2 = LLVMBC::Value::get_value_kind((Value *)this_02);
          this_03 = (SwitchInst *)0x0;
          if (VVar2 == Switch) {
            this_03 = this_02;
          }
        }
        if (this_03 != (SwitchInst *)0x0) {
          pVVar5 = LLVMBC::SwitchInst::getCondition(this_03);
          goto LAB_00127199;
        }
        uVar3 = LLVMBC::Instruction::getNumOperands(instruction);
        if (uVar3 != 0) {
          uVar6 = 0;
          do {
            pVVar5 = LLVMBC::Instruction::getOperand(instruction,uVar6);
            mark_used_value(this,pVVar5);
            uVar6 = uVar6 + 1;
          } while (uVar3 != uVar6);
        }
      }
      else {
        bVar1 = LLVMBC::BranchInst::isConditional(this_06);
        if (bVar1) {
          pVVar5 = LLVMBC::BranchInst::getCondition(this_06);
LAB_00127199:
          mark_used_value(this,pVVar5);
          return;
        }
      }
    }
    else {
      pVVar5 = LLVMBC::ReturnInst::getReturnValue(this_05);
      if (pVVar5 != (Value *)0x0) {
        pVVar5 = LLVMBC::ReturnInst::getReturnValue(this_05);
        goto LAB_00127199;
      }
    }
  }
  else {
    uVar3 = LLVMBC::PHINode::getNumIncomingValues(this_04);
    if (uVar3 != 0) {
      uVar6 = 0;
      do {
        pPVar4 = (PHINode *)LLVMBC::PHINode::getIncomingValue(this_04,uVar6);
        if (pPVar4 != this_04) {
          mark_used_value(this,(Value *)pPVar4);
        }
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
  }
  return;
}

Assistant:

void Converter::Impl::mark_used_values(const llvm::Instruction *instruction)
{
	if (auto *phi_inst = llvm::dyn_cast<llvm::PHINode>(instruction))
	{
		for (unsigned i = 0, n = phi_inst->getNumIncomingValues(); i < n; i++)
		{
			auto *incoming = phi_inst->getIncomingValue(i);
			// Ignore self-referential PHI. Someone else need to refer to us.
			if (incoming != phi_inst)
				mark_used_value(incoming);
		}
	}
	else if (const auto *ret_inst = llvm::dyn_cast<llvm::ReturnInst>(instruction))
	{
		if (ret_inst->getReturnValue())
			mark_used_value(ret_inst->getReturnValue());
	}
	else if (const auto *cond_inst = llvm::dyn_cast<llvm::BranchInst>(instruction))
	{
		if (cond_inst->isConditional())
			mark_used_value(cond_inst->getCondition());
	}
	else if (const auto *switch_inst = llvm::dyn_cast<llvm::SwitchInst>(instruction))
	{
		mark_used_value(switch_inst->getCondition());
	}
	else
	{
		for (unsigned i = 0, n = instruction->getNumOperands(); i < n; i++)
			mark_used_value(instruction->getOperand(i));
	}
}